

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup.cpp
# Opt level: O2

void SetupCMD(CmdLine *cmd)

{
  allocator local_91;
  String local_90;
  String local_70;
  String local_50;
  String local_30;
  
  std::__cxx11::string::string((string *)&local_30,"bar",&local_91);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  Args::details::
  API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
  ::addArgWithNameOnly<char_const(&)[4]>
            ((API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
              *)cmd,(char (*) [4])"foo",true,true,&local_30,&local_50,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  Args::CmdLine::parse(cmd);
  return;
}

Assistant:

void SetupCMD( Args::CmdLine & cmd )
{
	cmd.addArgWithNameOnly( "foo", true, true, "bar" );

	cmd.parse();
}